

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkbox.cpp
# Opt level: O0

void radio_check_invalid_proc
               (Am_Object *group,Am_Object *which_part,int left,int top,int width,int height)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Object local_a0;
  Am_Object local_98;
  int local_90;
  int local_8c;
  int final_height;
  int final_width;
  int final_top;
  int final_left;
  int display_top;
  int display_left;
  int part_height;
  int part_width;
  int part_top;
  int part_left;
  int offset_left;
  int iStack_5c;
  bool box_on_left;
  int box_width;
  int my_height;
  int my_width;
  int my_top;
  int my_left;
  Am_Object local_40;
  Am_Object owner;
  Am_Slot_Flags flags;
  int height_local;
  int width_local;
  int top_local;
  int left_local;
  Am_Object *which_part_local;
  Am_Object *group_local;
  
  owner.data = (Am_Object_Data *)0x7;
  Am_Object::Get_Owner(&local_40,(Am_Slot_Flags)group);
  bVar1 = Am_Object::Valid(&local_40);
  if (bVar1) {
    pAVar2 = Am_Object::Get(group,100,7);
    my_width = Am_Value::operator_cast_to_int(pAVar2);
    pAVar2 = Am_Object::Get(group,0x65,7);
    my_height = Am_Value::operator_cast_to_int(pAVar2);
    pAVar2 = Am_Object::Get(group,0x66,7);
    box_width = Am_Value::operator_cast_to_int(pAVar2);
    pAVar2 = Am_Object::Get(group,0x67,7);
    iStack_5c = Am_Value::operator_cast_to_int(pAVar2);
    pAVar2 = Am_Object::Get(group,0x188,7);
    offset_left = Am_Value::operator_cast_to_int(pAVar2);
    pAVar2 = Am_Object::Get(group,0x186,7);
    part_left._3_1_ = Am_Value::operator_cast_to_bool(pAVar2);
    part_top = 5;
    pAVar2 = Am_Object::Get(which_part,100,7);
    part_width = Am_Value::operator_cast_to_int(pAVar2);
    pAVar2 = Am_Object::Get(which_part,0x65,7);
    part_height = Am_Value::operator_cast_to_int(pAVar2);
    pAVar2 = Am_Object::Get(which_part,0x66,7);
    display_left = Am_Value::operator_cast_to_int(pAVar2);
    pAVar2 = Am_Object::Get(which_part,0x67,7);
    display_top = Am_Value::operator_cast_to_int(pAVar2);
    box_width = box_width - (offset_left + part_top);
    if ((part_left._3_1_ & 1) != 0) {
      my_width = offset_left + part_top + my_width;
    }
    final_left = (box_width - display_left) / 2;
    final_top = (iStack_5c - display_top) / 2;
    Am_Invalid_Rectangle_Intersect
              ((left + final_left) - part_width,(top + final_top) - part_height,width,height,
               my_width,my_height,box_width,iStack_5c,&final_width,&final_height,&local_8c,&local_90
              );
    if ((0 < local_8c) && (0 < local_90)) {
      Am_Object::Am_Object(&local_98,&local_40);
      Am_Object::Am_Object(&local_a0,group);
      Am_Invalidate(&local_98,&local_a0,final_width,final_height,local_8c,local_90);
      Am_Object::~Am_Object(&local_a0);
      Am_Object::~Am_Object(&local_98);
    }
  }
  Am_Object::~Am_Object(&local_40);
  return;
}

Assistant:

Am_Define_Method(Am_Invalid_Method, void, radio_check_invalid,
                 (Am_Object group, Am_Object which_part, int left, int top,
                  int width, int height))
{
  const Am_Slot_Flags flags = Am_NO_DEPENDENCY | Am_RETURN_ZERO_ON_ERROR;
  Am_Object owner = group.Get_Owner(flags);
  if (owner.Valid()) {
    int my_left = group.Get(Am_LEFT, flags);
    int my_top = group.Get(Am_TOP, flags);
    int my_width = group.Get(Am_WIDTH, flags);
    int my_height = group.Get(Am_HEIGHT, flags);
    int box_width = group.Get(Am_BOX_WIDTH, flags);
    bool box_on_left = group.Get(Am_BOX_ON_LEFT, flags);
    int offset_left = 5;
    int part_left = which_part.Get(Am_LEFT, flags);
    int part_top = which_part.Get(Am_TOP, flags);
    int part_width = which_part.Get(Am_WIDTH, flags);
    int part_height = which_part.Get(Am_HEIGHT, flags);
    my_width -= box_width + offset_left;
    if (box_on_left)
      my_left += box_width + offset_left;
    int display_left = (my_width - part_width) / 2;
    int display_top = (my_height - part_height) / 2;
    left = left + display_left - part_left;
    top = top + display_top - part_top;
    int final_left, final_top, final_width, final_height;
    // clip incoming rectangle to my rectangle
    Am_Invalid_Rectangle_Intersect(left, top, width, height, my_left, my_top,
                                   my_width, my_height, final_left, final_top,
                                   final_width, final_height);
    if ((final_width > 0) && (final_height > 0))
      Am_Invalidate(owner, group, final_left, final_top, final_width,
                    final_height);
  }
}